

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,Const *const_)

{
  char *pcVar1;
  Enum EVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  float fVar8;
  v128 local_90;
  v128 local_80;
  v128 local_70;
  v128 local_60;
  ulong local_50;
  uint64_t significand_1;
  char *sign_1;
  uint64_t f64_bits;
  char *pcStack_30;
  uint32_t significand;
  char *sign;
  Type TStack_20;
  uint32_t f32_bits;
  Const *local_18;
  Const *const__local;
  CWriter *this_local;
  
  local_18 = const_;
  const__local = (Const *)this;
  TStack_20 = Const::type(const_);
  EVar2 = Type::operator_cast_to_Enum(&stack0xffffffffffffffe0);
  switch(EVar2) {
  case V128:
    local_60 = Const::vec128(local_18);
    uVar3 = v128::u32(&local_60,0);
    local_70 = Const::vec128(local_18);
    uVar4 = v128::u32(&local_70,1);
    local_80 = Const::vec128(local_18);
    uVar5 = v128::u32(&local_80,2);
    local_90 = Const::vec128(local_18);
    uVar6 = v128::u32(&local_90,3);
    Writef(this,"simde_wasm_i32x4_const(0x%08x, 0x%08x, 0x%08x, 0x%08x)",(ulong)uVar3,(ulong)uVar4,
           (ulong)uVar5,(ulong)uVar6);
    break;
  case F64:
    sign_1 = (char *)Const::f64_bits(local_18);
    if (((ulong)sign_1 & 0x7ff0000000000000) == 0x7ff0000000000000) {
      pcVar1 = "\n\n";
      if (((ulong)sign_1 & 0x8000000000000000) != 0) {
        pcVar1 = "  -";
      }
      significand_1 = (uint64_t)(pcVar1 + 2);
      local_50 = (ulong)sign_1 & 0xfffffffffffff;
      if (local_50 == 0) {
        Writef(this,"%sINFINITY",significand_1);
      }
      else {
        Writef(this,"f64_reinterpret_i64(0x%016lx) /* %snan:0x%013lx */",sign_1,significand_1,
               local_50);
      }
    }
    else if (sign_1 == (char *)0x8000000000000000) {
      Writef(this,"-0.0");
    }
    else {
      Bitcast<double,unsigned_long&>((unsigned_long *)&sign_1);
      Writef(this,"%.17g");
    }
    break;
  case F32:
    sign._4_4_ = Const::f32_bits(local_18);
    if ((sign._4_4_ & 0x7f800000) == 0x7f800000) {
      pcStack_30 = "\n\n";
      if ((sign._4_4_ & 0x80000000) != 0) {
        pcStack_30 = "  -";
      }
      pcStack_30 = pcStack_30 + 2;
      f64_bits._4_4_ = sign._4_4_ & 0x7fffff;
      if (f64_bits._4_4_ == 0) {
        Writef(this,"%sINFINITY",pcStack_30);
      }
      else {
        Writef(this,"f32_reinterpret_i32(0x%08x) /* %snan:0x%06x */",(ulong)sign._4_4_,pcStack_30,
               (ulong)f64_bits._4_4_);
      }
    }
    else if (sign._4_4_ == 0x80000000) {
      Writef(this,"-0.f");
    }
    else {
      fVar8 = Bitcast<float,unsigned_int&>((uint *)((long)&sign + 4));
      Writef(this,"%.9g",(double)fVar8);
    }
    break;
  case I64:
    uVar7 = Const::u64(local_18);
    Writef(this,"%luull",uVar7);
    break;
  case I32:
    uVar3 = Const::u32(local_18);
    Writef(this,"%uu",(ulong)uVar3);
    break;
  default:
    abort();
  }
  return;
}

Assistant:

void CWriter::Write(const Const& const_) {
  switch (const_.type()) {
    case Type::I32:
      Writef("%uu", static_cast<int32_t>(const_.u32()));
      break;

    case Type::I64:
      Writef("%" PRIu64 "ull", static_cast<int64_t>(const_.u64()));
      break;

    case Type::F32: {
      uint32_t f32_bits = const_.f32_bits();
      // TODO(binji): Share with similar float info in interp.cc and literal.cc
      if ((f32_bits & 0x7f800000u) == 0x7f800000u) {
        const char* sign = (f32_bits & 0x80000000) ? "-" : "";
        uint32_t significand = f32_bits & 0x7fffffu;
        if (significand == 0) {
          // Infinity.
          Writef("%sINFINITY", sign);
        } else {
          // Nan.
          Writef("f32_reinterpret_i32(0x%08x) /* %snan:0x%06x */", f32_bits,
                 sign, significand);
        }
      } else if (f32_bits == 0x80000000) {
        // Negative zero. Special-cased so it isn't written as -0 below.
        Writef("-0.f");
      } else {
        Writef("%.9g", Bitcast<float>(f32_bits));
      }
      break;
    }

    case Type::F64: {
      uint64_t f64_bits = const_.f64_bits();
      // TODO(binji): Share with similar float info in interp.cc and literal.cc
      if ((f64_bits & 0x7ff0000000000000ull) == 0x7ff0000000000000ull) {
        const char* sign = (f64_bits & 0x8000000000000000ull) ? "-" : "";
        uint64_t significand = f64_bits & 0xfffffffffffffull;
        if (significand == 0) {
          // Infinity.
          Writef("%sINFINITY", sign);
        } else {
          // Nan.
          Writef("f64_reinterpret_i64(0x%016" PRIx64 ") /* %snan:0x%013" PRIx64
                 " */",
                 f64_bits, sign, significand);
        }
      } else if (f64_bits == 0x8000000000000000ull) {
        // Negative zero. Special-cased so it isn't written as -0 below.
        Writef("-0.0");
      } else {
        Writef("%.17g", Bitcast<double>(f64_bits));
      }
      break;
    }
    case Type::V128: {
      Writef("simde_wasm_i32x4_const(0x%08x, 0x%08x, 0x%08x, 0x%08x)",
             const_.vec128().u32(0), const_.vec128().u32(1),
             const_.vec128().u32(2), const_.vec128().u32(3));
      break;
    }

    default:
      WABT_UNREACHABLE;
  }
}